

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

bool __thiscall adios2::query::BlockHit::applyExtension(BlockHit *this,BlockHit *tmp)

{
  size_t sVar1;
  size_t sVar2;
  pointer ppVar3;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *ppVar4;
  bool bVar5;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *ppVar6;
  pointer ppVar7;
  byte bVar8;
  vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range3;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  b;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  box;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  
  sVar1 = this->m_ID;
  sVar2 = tmp->m_ID;
  if (sVar1 == sVar2) {
    ppVar3 = (tmp->m_Regions).
             super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar7 = (tmp->m_Regions).
                  super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1)
    {
      std::
      pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::pair(&local_90,ppVar7);
      ppVar4 = (this->m_Regions).
               super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar8 = 0;
      for (ppVar6 = (this->m_Regions).
                    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar4; ppVar6 = ppVar6 + 1
          ) {
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::pair(&local_60,ppVar6);
        bVar5 = helper::IdenticalBoxes(&local_60,&local_90);
        bVar8 = bVar8 | bVar5;
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair(&local_60);
      }
      if (bVar8 == 0) {
        std::
        vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::push_back(&this->m_Regions,&local_90);
      }
      std::
      pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::~pair(&local_90);
    }
  }
  return sVar1 == sVar2;
}

Assistant:

bool BlockHit::applyExtension(const BlockHit &tmp)
{
    if (m_ID != tmp.m_ID)
        return false;

    // check subblocks:
    for (auto b : tmp.m_Regions)
    {
        bool duplicated = false;
        for (auto box : m_Regions)
        {
            if (adios2::helper::IdenticalBoxes(box, b))
            {
                duplicated = true;
                continue;
            }
        }
        if (!duplicated)
            m_Regions.push_back(b);
    }

    return true;
}